

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

void JitFFI::SysV64::create_return(JitFuncCallerCreater *jfcc,RetData *retdata)

{
  ArgType AVar1;
  uint *puVar2;
  uint local_30;
  uint local_2c;
  StructTypeData *local_28;
  StructTypeData *st;
  uint rec [2];
  RetData *retdata_local;
  JitFuncCallerCreater *jfcc_local;
  
  if (retdata->type != '\n') {
    rec = (uint  [2])retdata;
    memset(&st,0,8);
    if (*(char *)rec == '\x02') {
      local_28 = ArgTypeInfo::RetData::getstd((RetData *)rec);
      if (*(short *)((long)rec + 2) != 0) {
        AVar1 = ArgTypeInfo::StructTypeData::get(local_28,0);
        local_2c = (uint)*(ushort *)((long)rec + 2);
        local_30 = 8;
        puVar2 = std::min<unsigned_int>(&local_2c,&local_30);
        create_return_base(jfcc,AVar1,*puVar2,(uint *)&st);
      }
      if (8 < *(ushort *)((long)rec + 2)) {
        OpCode_x64::add_rx_byte((jfcc->super_JitFuncCallerCreaterX64).data,rbx,'\b');
        AVar1 = ArgTypeInfo::StructTypeData::get(local_28,1);
        create_return_base(jfcc,AVar1,*(ushort *)((long)rec + 2) - 8,(uint *)&st);
      }
    }
    else {
      create_return_base(jfcc,(uint)*(byte *)rec,(uint)*(ushort *)((long)rec + 2),(uint *)&st);
    }
  }
  return;
}

Assistant:

static void create_return(JitFuncCallerCreater &jfcc, const ArgTypeInfo::RetData &retdata) {
			if (retdata.type != AT_Memory) {
				unsigned int rec[2] = { 0 }; // rax/rdx, xmm0/xmm1
				if (retdata.type == AT_Struct) {
					auto &st = retdata.getstd();
					if (retdata.size > 0) {
						create_return_base(jfcc, st.get(0), std::min<unsigned>(retdata.size, 8), rec);
					}
					if (retdata.size > 8) {
						add_rx_byte(jfcc.data, rbx, 8);
						create_return_base(jfcc, st.get(1), retdata.size - 8, rec);
					}
				}
				else {
					create_return_base(jfcc, static_cast<ArgType>(retdata.type), retdata.size, rec);
				}
			}
		}